

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

string * __thiscall
loltoml::v_0_1_1::detail::parser_t<comments_skipper_t>::parse_multiline_string_abi_cxx11_
          (string *__return_storage_ptr__,parser_t<comments_skipper_t> *this)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  uint32_t uVar4;
  size_t offset;
  parser_error_t *ppVar5;
  char cVar6;
  allocator local_89;
  string local_88;
  char local_61;
  size_t sStack_60;
  char ch_1;
  size_t escape_sequence_offset;
  string local_50;
  char local_2d;
  char ch;
  undefined1 local_19;
  parser_t<comments_skipper_t> *local_18;
  parser_t<comments_skipper_t> *this_local;
  string *result;
  
  local_19 = 0;
  local_18 = this;
  this_local = (parser_t<comments_skipper_t> *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  cVar1 = input_stream_t::peek(&this->input);
  if ((cVar1 == '\r') || (cVar1 = input_stream_t::peek(&this->input), cVar1 == '\n')) {
    parse_new_line(this);
  }
  while( true ) {
    while( true ) {
      cVar1 = input_stream_t::peek(&this->input);
      cVar6 = (char)__return_storage_ptr__;
      if ((cVar1 != '\r') && (cVar1 = input_stream_t::peek(&this->input), cVar1 != '\n')) break;
      parse_new_line(this);
      std::__cxx11::string::push_back(cVar6);
    }
    local_2d = input_stream_t::get(&this->input);
    bVar2 = iscontrol(local_2d);
    if (bVar2) break;
    if (local_2d == '\"') {
      cVar1 = input_stream_t::peek(&this->input);
      if (cVar1 == '\"') {
        input_stream_t::get(&this->input);
        cVar1 = input_stream_t::peek(&this->input);
        if (cVar1 == '\"') {
          input_stream_t::get(&this->input);
          return __return_storage_ptr__;
        }
        std::__cxx11::string::push_back(cVar6);
      }
      std::__cxx11::string::push_back(cVar6);
    }
    else if (local_2d == '\\') {
      cVar1 = input_stream_t::peek(&this->input);
      if ((cVar1 == '\r') || (cVar1 = input_stream_t::peek(&this->input), cVar1 == '\n')) {
        parse_new_line(this);
        while( true ) {
          cVar1 = input_stream_t::peek(&this->input);
          iVar3 = isspace((int)cVar1);
          if (iVar3 == 0) break;
          input_stream_t::get(&this->input);
        }
      }
      else {
        sStack_60 = last_char_offset(this);
        local_61 = input_stream_t::get(&this->input);
        if (local_61 == 'b') {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (local_61 == 't') {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (local_61 == 'n') {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (local_61 == 'f') {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (local_61 == 'r') {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (local_61 == '\"') {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (local_61 == '\\') {
          std::__cxx11::string::push_back(cVar6);
        }
        else if (local_61 == 'u') {
          uVar4 = parse_4_digit_codepoint(this);
          process_codepoint(this,uVar4,sStack_60,__return_storage_ptr__);
        }
        else {
          if (local_61 != 'U') {
            ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_88,"Invalid escape-sequence",&local_89);
            parser_error_t::parser_error_t(ppVar5,&local_88,sStack_60);
            __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
          }
          uVar4 = parse_8_digit_codepoint(this);
          process_codepoint(this,uVar4,sStack_60,__return_storage_ptr__);
        }
      }
    }
    else {
      std::__cxx11::string::push_back(cVar6);
    }
  }
  escape_sequence_offset._6_1_ = 1;
  ppVar5 = (parser_error_t *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_50,"Control characters must be escaped",
             (allocator *)((long)&escape_sequence_offset + 7));
  offset = last_char_offset(this);
  parser_error_t::parser_error_t(ppVar5,&local_50,offset);
  escape_sequence_offset._6_1_ = 0;
  __cxa_throw(ppVar5,&parser_error_t::typeinfo,parser_error_t::~parser_error_t);
}

Assistant:

std::string parse_multiline_string() {
        std::string result;

        // Ignore first new-line after open quotes.
        if (input.peek() == '\r' || input.peek() == '\n') {
            parse_new_line();
        }

        while (true) {
            if (input.peek() == '\r' || input.peek() == '\n') {
                parse_new_line();
                result.push_back('\n');
                continue;
            }

            char ch = input.get();
            if (iscontrol(ch)) {
                throw parser_error_t("Control characters must be escaped", last_char_offset());
            } else if (ch == '"') {
                if (input.peek() == '"') {
                    input.get();
                    if (input.peek() == '"') {
                        input.get();
                        break;
                    }
                    result.push_back('"');
                }
                result.push_back('"');
            } else if (ch == '\\') {
                if (input.peek() == '\r' || input.peek() == '\n') {
                    parse_new_line();
                    while (std::isspace(input.peek())) {
                        input.get();
                    }
                    continue;
                }

                std::size_t escape_sequence_offset = last_char_offset();
                char ch = input.get();
                if (ch == 'b') {
                    result.push_back('\b');
                } else if (ch == 't') {
                    result.push_back('\t');
                } else if (ch == 'n') {
                    result.push_back('\n');
                } else if (ch == 'f') {
                    result.push_back('\f');
                } else if (ch == 'r') {
                    result.push_back('\r');
                } else if (ch == '"') {
                    result.push_back('"');
                } else if (ch == '\\') {
                    result.push_back('\\');
                } else if (ch == 'u') {
                    process_codepoint(parse_4_digit_codepoint(), escape_sequence_offset, result);
                } else if (ch == 'U') {
                    process_codepoint(parse_8_digit_codepoint(), escape_sequence_offset, result);
                } else {
                    throw parser_error_t("Invalid escape-sequence", escape_sequence_offset);
                }
            } else {
                result.push_back(ch);
            }
        }

        return result;
    }